

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrawfont.cpp
# Opt level: O0

QList<QFontDatabase::WritingSystem> * __thiscall QRawFont::supportedWritingSystems(QRawFont *this)

{
  bool bVar1;
  uint uVar2;
  QRawFontPrivate *this_00;
  qsizetype qVar3;
  QList<QFontDatabase::WritingSystem> *in_RDI;
  long in_FS_OFFSET;
  int i_2;
  size_t i_1;
  size_t i;
  uchar *bigEndianCodepageRanges;
  uchar *bigEndianUnicodeRanges;
  uchar *data;
  QList<QFontDatabase::WritingSystem> *writingSystems;
  QSupportedWritingSystems ws;
  QByteArray os2Table;
  quint32 codepageRanges [2];
  quint32 unicodeRanges [4];
  WritingSystem in_stack_ffffffffffffff5c;
  QList<QFontDatabase::WritingSystem> *this_01;
  int local_84;
  quint32 *codePageRange;
  quint32 *unicodeRange;
  char *in_stack_ffffffffffffff90;
  QByteArray local_38;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (WritingSystem *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = in_RDI;
  QList<QFontDatabase::WritingSystem>::QList((QList<QFontDatabase::WritingSystem> *)0x791c27);
  this_00 = QExplicitlySharedDataPointer<QRawFontPrivate>::operator->
                      ((QExplicitlySharedDataPointer<QRawFontPrivate> *)0x791c31);
  bVar1 = QRawFontPrivate::isValid(this_00);
  if (bVar1) {
    local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    fontTable((QRawFont *)this_01,in_stack_ffffffffffffff90);
    qVar3 = QByteArray::size(&local_38);
    if (0x56 < qVar3) {
      QByteArray::constData((QByteArray *)0x791c9d);
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      for (unicodeRange = (quint32 *)0x0; unicodeRange < (quint32 *)0x4;
          unicodeRange = (quint32 *)((long)unicodeRange + 1)) {
        uVar2 = qFromBigEndian<unsigned_int>(in_RDI);
        *(uint *)((long)&local_18 + (long)unicodeRange * 4) = uVar2;
      }
      for (codePageRange = (quint32 *)0x0; codePageRange < (quint32 *)0x2;
          codePageRange = (quint32 *)((long)codePageRange + 1)) {
        uVar2 = qFromBigEndian<unsigned_int>(in_RDI);
        *(uint *)((long)&local_20 + (long)codePageRange * 4) = uVar2;
      }
      QPlatformFontDatabase::writingSystemsFromTrueTypeBits(unicodeRange,codePageRange);
      for (local_84 = 0; local_84 < 0x22; local_84 = local_84 + 1) {
        bVar1 = QSupportedWritingSystems::supported
                          ((QSupportedWritingSystems *)in_RDI,in_stack_ffffffffffffff5c);
        if (bVar1) {
          QList<QFontDatabase::WritingSystem>::append
                    ((QList<QFontDatabase::WritingSystem> *)0x791dcc,in_stack_ffffffffffffff5c);
        }
      }
      QSupportedWritingSystems::~QSupportedWritingSystems((QSupportedWritingSystems *)in_RDI);
    }
    QByteArray::~QByteArray((QByteArray *)0x791def);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_01;
  }
  __stack_chk_fail();
}

Assistant:

QList<QFontDatabase::WritingSystem> QRawFont::supportedWritingSystems() const
{
    QList<QFontDatabase::WritingSystem> writingSystems;
    if (d->isValid()) {
        QByteArray os2Table = fontTable("OS/2");
        if (os2Table.size() > 86) {
            const uchar * const data = reinterpret_cast<const uchar *>(os2Table.constData());
            const uchar * const bigEndianUnicodeRanges  = data + 42;
            const uchar * const bigEndianCodepageRanges = data + 78;

            quint32 unicodeRanges[4];
            quint32 codepageRanges[2];

            for (size_t i = 0; i < sizeof unicodeRanges / sizeof *unicodeRanges; ++i)
                unicodeRanges[i] = qFromBigEndian<quint32>(bigEndianUnicodeRanges + i * sizeof(quint32));

            for (size_t i = 0; i < sizeof codepageRanges / sizeof *codepageRanges; ++i)
                codepageRanges[i] = qFromBigEndian<quint32>(bigEndianCodepageRanges + i * sizeof(quint32));

            QSupportedWritingSystems ws = QPlatformFontDatabase::writingSystemsFromTrueTypeBits(unicodeRanges, codepageRanges);
            for (int i = 0; i < QFontDatabase::WritingSystemsCount; ++i) {
                if (ws.supported(QFontDatabase::WritingSystem(i)))
                    writingSystems.append(QFontDatabase::WritingSystem(i));
            }
        }
    }

    return writingSystems;
}